

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O2

void printTimestamp(int timestamp)

{
  ulong uVar1;
  
  uVar1 = (long)timestamp / 0x3c;
  printf("%.2d:%.2d:%.2d",
         (long)((ulong)(uint)((int)((long)timestamp / 0xe10) >> 0x1f) << 0x20 |
               (long)timestamp / 0xe10 & 0xffffffffU) % 0x3c & 0xffffffff,
         (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c & 0xffffffff,
         (long)timestamp % 0x3c & 0xffffffff);
  return;
}

Assistant:

static void printTimestamp(int timestamp)
{
    const int seconds = timestamp % 60;
    timestamp /= 60;
    const int minutes = timestamp % 60;
    timestamp /= 60;
    const int hours = timestamp % 60;
    printf("%.2d:%.2d:%.2d", hours, minutes, seconds);
}